

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

void __thiscall MipsParser::setOmittedRegisters(MipsParser *this,tMipsOpcode *opcode)

{
  if ((opcode->flags & 4) != 0) {
    (this->registers).grd.type = (this->registers).grs.type;
    std::__cxx11::string::_M_assign((string *)&(this->registers).grd.name);
    (this->registers).grd.num = (this->registers).grs.num;
  }
  if ((opcode->flags & 8) != 0) {
    (this->registers).grt.type = (this->registers).grs.type;
    std::__cxx11::string::_M_assign((string *)&(this->registers).grt.name);
    (this->registers).grt.num = (this->registers).grs.num;
  }
  if ((opcode->flags & 0x10) != 0) {
    (this->registers).grt.type = (this->registers).grd.type;
    std::__cxx11::string::_M_assign((string *)&(this->registers).grt.name);
    (this->registers).grt.num = (this->registers).grd.num;
  }
  if ((opcode->flags & 0x200) != 0) {
    (this->registers).frd.type = (this->registers).frs.type;
    std::__cxx11::string::_M_assign((string *)&(this->registers).frd.name);
    (this->registers).frd.num = (this->registers).frs.num;
  }
  if ((opcode->flags & 0x1000000) != 0) {
    (this->registers).rspvrd.type = (this->registers).rspvrs.type;
    std::__cxx11::string::_M_assign((string *)&(this->registers).rspvrd.name);
    (this->registers).rspvrd.num = (this->registers).rspvrs.num;
  }
  return;
}

Assistant:

void MipsParser::setOmittedRegisters(const tMipsOpcode& opcode)
{
	// copy over omitted registers
	if (opcode.flags & MO_RSD)
		registers.grd = registers.grs;

	if (opcode.flags & MO_RST)
		registers.grt = registers.grs;

	if (opcode.flags & MO_RDT)
		registers.grt = registers.grd;

	if (opcode.flags & MO_FRSD)
		registers.frd = registers.frs;

	if (opcode.flags & MO_RSP_VRSD)
		registers.rspvrd = registers.rspvrs;
}